

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

BOOL js_object_has_name(JSContext *ctx,JSValue obj)

{
  JSRuntime *pJVar1;
  uint uVar2;
  list_head *plVar3;
  void **ppvVar4;
  uint uVar5;
  ulong uVar6;
  
  pJVar1 = ctx->rt;
  uVar5 = *(uint *)((long)&(pJVar1->mf).js_malloc +
                   (long)(int)(~(uint)(pJVar1->malloc_state).malloc_count | 0xffffffc9) * 4);
  uVar2 = 0;
  if (uVar5 == 0) {
    plVar3 = (list_head *)0x0;
    ppvVar4 = (void **)0x0;
  }
  else {
    plVar3 = (list_head *)0x0;
    do {
      uVar6 = (ulong)uVar5;
      ppvVar4 = &(pJVar1->malloc_state).opaque + uVar6;
      if (*(int *)((long)&(pJVar1->malloc_state).opaque + uVar6 * 8 + 4) == 0x36) {
        plVar3 = (ctx->link).prev + (uVar6 - 1);
        break;
      }
      uVar5 = *(uint *)ppvVar4;
      ppvVar4 = (void **)0x0;
      uVar5 = uVar5 & 0x3ffffff;
    } while (uVar5 != 0);
  }
  if (((ppvVar4 != (void **)0x0) && (uVar2 = 1, *(uint *)ppvVar4 < 0x40000000)) &&
     (*(int *)&plVar3->next == -7)) {
    uVar2 = (uint)(((ulong)plVar3->prev->prev & 0x7fffffff00000000) != 0);
  }
  return uVar2;
}

Assistant:

static force_inline JSShapeProperty *find_own_property(JSProperty **ppr,
                                                       JSObject *p,
                                                       JSAtom atom)
{
    JSShape *sh;
    JSShapeProperty *pr, *prop;
    intptr_t h;
    sh = p->shape;
    h = (uintptr_t)atom & sh->prop_hash_mask;
    h = prop_hash_end(sh)[-h - 1];
    prop = get_shape_prop(sh);
    while (h) {
        pr = &prop[h - 1];
        if (likely(pr->atom == atom)) {
            *ppr = &p->prop[h - 1];
            /* the compiler should be able to assume that pr != NULL here */
            return pr;
        }
        h = pr->hash_next;
    }
    *ppr = NULL;
    return NULL;
}